

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void act_clause2_bump(sat_solver2 *s,clause *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int Id;
  uint *act_clas;
  clause *c_local;
  sat_solver2 *s_local;
  
  piVar3 = veci_begin(&s->act_clas);
  iVar1 = clause_id(c);
  if (-1 < iVar1) {
    iVar2 = veci_size(&s->act_clas);
    if (iVar1 < iVar2) {
      piVar3[iVar1] = s->cla_inc + piVar3[iVar1];
      if ((piVar3[iVar1] & 0x80000000U) != 0) {
        act_clause2_rescale(s);
      }
      return;
    }
  }
  __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
}

Assistant:

static inline void act_clause2_bump(sat_solver2* s, clause*c) {
    unsigned * act_clas = (unsigned *)veci_begin(&s->act_clas);
    int Id = clause_id(c);
    assert( Id >= 0 && Id < veci_size(&s->act_clas) );
    act_clas[Id] += s->cla_inc;
    if (act_clas[Id] & 0x80000000)
        act_clause2_rescale(s);
}